

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

void __thiscall
blc::network::Socket::Socket(Socket *this,string *address,int port,bool block,int mode,int type)

{
  pointer pcVar1;
  
  (this->super_stream)._vptr_stream = (_func_int **)&PTR_write_0011aba0;
  this->_socket = 0;
  (this->_address)._M_dataplus._M_p = (pointer)&(this->_address).field_2;
  pcVar1 = (address->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_address,pcVar1,pcVar1 + address->_M_string_length);
  this->_port = port;
  this->_block = block;
  this->_mode = mode;
  this->_type = type;
  this->_opened = false;
  return;
}

Assistant:

blc::network::Socket::Socket(std::string address, int port, bool block, int mode, int type) :	_socket(0),
												_address(address),
												_port(port),
												_block(block),
												_mode(mode),
												_type(type),
												_opened(false) {
}